

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_soderlind.c
# Opt level: O3

SUNAdaptController SUNAdaptController_H211(SUNContext_conflict sunctx)

{
  undefined8 *puVar1;
  SUNAdaptController p_Var2;
  
  p_Var2 = SUNAdaptController_Soderlind(sunctx);
  puVar1 = (undefined8 *)p_Var2->content;
  *puVar1 = 0x3fd0000000000000;
  puVar1[1] = 0x3fd0000000000000;
  *(undefined4 *)(puVar1 + 2) = 0;
  *(undefined4 *)((long)puVar1 + 0x14) = 0;
  *(undefined4 *)(puVar1 + 3) = 0;
  *(undefined4 *)((long)puVar1 + 0x1c) = 0xbfd00000;
  puVar1[4] = 0;
  *(undefined4 *)((long)puVar1 + 0x54) = 1;
  return p_Var2;
}

Assistant:

SUNAdaptController SUNAdaptController_H211(SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);

  SUNAdaptController C = SUNAdaptController_Soderlind(sunctx);
  SUNCheckLastErrNull();

  SUNCheckCallNull(
    SUNAdaptController_SetParams_Soderlind(C, SUN_RCONST(0.25),
                                           SUN_RCONST(0.25), SUN_RCONST(0.0),
                                           -SUN_RCONST(0.25), SUN_RCONST(0.0)));

  return (C);
}